

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O1

void __thiscall EventQueue::Remove(EventQueue *this,Id id)

{
  iterator i;
  AutoLock _auto_lock_;
  Node *local_48;
  iterator local_40;
  AutoLock local_38;
  
  AutoLock::AutoLock(&local_38,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0x83);
  local_48 = ((this->mQueue).mHead)->next;
  if (local_48 != (this->mQueue).mTail) {
    do {
      if (*(int *)&(local_48->val->super_RefCount).field_0xc == id) {
        RefCount::Release(&local_48->val->super_RefCount);
        JetHead::list<Event_*>::iterator::erase(&local_40);
        local_48 = local_40.mNode;
        if (local_40.mNode != (Node *)0x0) {
          local_48 = (local_40.mNode)->prev;
        }
      }
      if (local_48 != (Node *)0x0) {
        local_48 = local_48->next;
      }
    } while (local_48 != (this->mQueue).mTail);
  }
  AutoLock::~AutoLock(&local_38);
  return;
}

Assistant:

void EventQueue::Remove( Event::Id id )
{
	DebugAutoLock( mLock );
	
	for (JetHead::list<Event*>::iterator i = mQueue.begin(); i != mQueue.end(); ++i)
	{
		if ((*i)->getEventId() == id)
		{
			(*i)->Release();
			i = i.erase();
			--i;
		}
	}
}